

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>
bloaty::TryOpenWebAssemblyFile
          (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *file)

{
  bool bVar1;
  pointer this;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *this_00;
  ObjectFile *in_RDI;
  string_view data;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>
  *in_stack_ffffffffffffffa0;
  string_view *in_stack_ffffffffffffffa8;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *this_01;
  _Head_base<0UL,_bloaty::ObjectFile_*,_false> this_02;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> local_28;
  string_view local_20;
  
  this_02._M_head_impl = in_RDI;
  this = std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::operator->
                   ((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                    0x1e4fd5);
  local_20 = InputFile::data(this);
  bVar1 = wasm::ReadMagic(in_stack_ffffffffffffffa8);
  if (bVar1) {
    this_00 = (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
              operator_new(0x18);
    this_01 = &local_28;
    std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::unique_ptr
              (this_00,(unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                       in_stack_ffffffffffffff98);
    wasm::WebAssemblyObjectFile::WebAssemblyObjectFile
              ((WebAssemblyObjectFile *)this_02._M_head_impl,
               (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)in_RDI);
    std::unique_ptr<bloaty::ObjectFile,std::default_delete<bloaty::ObjectFile>>::
    unique_ptr<std::default_delete<bloaty::ObjectFile>,void>
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)this_00,
               in_stack_ffffffffffffff98);
    std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::~unique_ptr
              (this_01);
  }
  else {
    std::unique_ptr<bloaty::ObjectFile,std::default_delete<bloaty::ObjectFile>>::
    unique_ptr<std::default_delete<bloaty::ObjectFile>,void>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return (__uniq_ptr_data<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>,_true,_true>)
         (tuple<bloaty::ObjectFile_*,_std::default_delete<bloaty::ObjectFile>_>)this_02._M_head_impl
  ;
}

Assistant:

std::unique_ptr<ObjectFile> TryOpenWebAssemblyFile(
    std::unique_ptr<InputFile>& file) {
  string_view data = file->data();
  if (wasm::ReadMagic(&data)) {
    return std::unique_ptr<ObjectFile>(
        new wasm::WebAssemblyObjectFile(std::move(file)));
  }

  return nullptr;
}